

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checked_shared_mutex.hpp
# Opt level: O2

void __thiscall
yamc::checked::detail::shared_mutex_base<yamc::rwlock::ReaderPrefer>::unlock
          (shared_mutex_base<yamc::rwlock::ReaderPrefer> *this)

{
  id tid;
  system_error *this_00;
  error_category *peVar1;
  error_code __ec;
  
  tid._M_thread = pthread_self();
  std::mutex::lock(&this->mtx_);
  if ((this->e_owner_)._M_thread == tid._M_thread) {
    (this->e_owner_)._M_thread = 0;
    rwlock::ReaderPrefer::release_wlock(&this->state_);
    validator::deadlock::unlocked((uintptr_t)this,tid,false);
    std::condition_variable::notify_all();
    pthread_mutex_unlock((pthread_mutex_t *)&this->mtx_);
    return;
  }
  this_00 = (system_error *)__cxa_allocate_exception(0x20);
  peVar1 = (error_category *)std::_V2::generic_category();
  __ec._M_cat = peVar1;
  __ec._0_8_ = 1;
  std::system_error::system_error(this_00,__ec,"invalid unlock");
  __cxa_throw(this_00,&std::system_error::typeinfo,std::system_error::~system_error);
}

Assistant:

void unlock()
  {
    const auto tid = std::this_thread::get_id();
    std::lock_guard<decltype(mtx_)> lk(mtx_);
    if (e_owner_ != tid) {
      // owner thread
#if YAMC_CHECKED_CALL_ABORT
      std::abort();
#else
      throw std::system_error(std::make_error_code(std::errc::operation_not_permitted), "invalid unlock");
#endif
    }
    e_owner_ = {};
    RwLockPolicy::release_wlock(state_);
    validator::unlocked(reinterpret_cast<uintptr_t>(this), tid, false);
    cv_.notify_all();
  }